

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *recorder,Hasher *h,VkPipelineLibraryCreateInfoKHR *info)

{
  bool bVar1;
  ulong uVar2;
  uint32_t i;
  ulong uVar3;
  Hash hash;
  Hash local_38;
  
  local_38 = 0;
  uVar2 = (ulong)info->libraryCount;
  h->h = h->h * 0x100000001b3 ^ uVar2;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    bVar1 = StateRecorder::get_hash_for_pipeline_library_handle
                      (recorder,info->pLibraries[uVar3],&local_38);
    if (!bVar1) break;
    h->h = (local_38 & 0xffffffff ^ h->h * 0x100000001b3) * 0x100000001b3 ^ local_38 >> 0x20;
    uVar2 = (ulong)info->libraryCount;
  }
  return uVar2 <= uVar3;
}

Assistant:

static bool hash_pnext_struct(const StateRecorder *recorder,
                              Hasher &h,
                              const VkPipelineLibraryCreateInfoKHR &info)
{
	Hash hash = 0;
	h.u32(info.libraryCount);

	for (uint32_t i = 0; i < info.libraryCount; i++)
	{
		if (!recorder->get_hash_for_pipeline_library_handle(info.pLibraries[i], &hash))
			return false;
		h.u64(hash);
	}

	return true;
}